

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O0

void __thiscall
cmOrderDirectoriesConstraint::FindConflicts(cmOrderDirectoriesConstraint *this,uint index)

{
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *this_00;
  ulong uVar4;
  pair<int,_int> local_28;
  ConflictPair p;
  string *dir;
  uint i;
  uint index_local;
  cmOrderDirectoriesConstraint *this_local;
  
  dir._4_4_ = index;
  _i = this;
  for (dir._0_4_ = 0; uVar4 = (ulong)(uint)dir,
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->OD->OriginalDirectories), uVar4 < sVar3; dir._0_4_ = (uint)dir + 1) {
    p = (ConflictPair)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&this->OD->OriginalDirectories,(ulong)(uint)dir);
    bVar1 = cmOrderDirectories::IsSameDirectory(this->OD,(string *)p,&this->Directory);
    if ((!bVar1) &&
       (uVar2 = (*this->_vptr_cmOrderDirectoriesConstraint[3])(this,p), (uVar2 & 1) != 0)) {
      std::pair<int,_int>::pair<int_&,_unsigned_int_&,_true>
                (&local_28,&this->DirectoryIndex,(uint *)((long)&dir + 4));
      this_00 = &std::
                 vector<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>
                 ::operator[](&this->OD->ConflictGraph,(ulong)(uint)dir)->
                 super_vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>;
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                (this_00,&local_28);
    }
  }
  return;
}

Assistant:

void FindConflicts(unsigned int index)
    {
    for(unsigned int i=0; i < this->OD->OriginalDirectories.size(); ++i)
      {
      // Check if this directory conflicts with the entry.
      std::string const& dir = this->OD->OriginalDirectories[i];
      if (!this->OD->IsSameDirectory(dir, this->Directory) &&
          this->FindConflict(dir))
        {
        // The library will be found in this directory but this is not
        // the directory named for it.  Add an entry to make sure the
        // desired directory comes before this one.
        cmOrderDirectories::ConflictPair p(this->DirectoryIndex, index);
        this->OD->ConflictGraph[i].push_back(p);
        }
      }
    }